

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O0

void __thiscall
duckdb::BuiltinFunctions::AddFunction(BuiltinFunctions *this,AggregateFunctionSet *set)

{
  long in_RDI;
  CreateAggregateFunctionInfo info;
  AggregateFunctionSet *in_stack_fffffffffffffd78;
  AggregateFunctionSet *in_stack_fffffffffffffd80;
  CreateAggregateFunctionInfo *this_00;
  AggregateFunctionSet *in_stack_fffffffffffffde8;
  CreateAggregateFunctionInfo *in_stack_fffffffffffffdf0;
  CreateFunctionInfo *in_stack_fffffffffffffe00;
  Catalog *in_stack_fffffffffffffe08;
  CatalogTransaction in_stack_fffffffffffffe20;
  
  AggregateFunctionSet::AggregateFunctionSet(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  CreateAggregateFunctionInfo::CreateAggregateFunctionInfo
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  AggregateFunctionSet::~AggregateFunctionSet((AggregateFunctionSet *)0x2a4d047);
  this_00 = *(CreateAggregateFunctionInfo **)(in_RDI + 8);
  Catalog::CreateFunction
            (in_stack_fffffffffffffe08,in_stack_fffffffffffffe20,in_stack_fffffffffffffe00);
  CreateAggregateFunctionInfo::~CreateAggregateFunctionInfo(this_00);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(AggregateFunctionSet set) {
	CreateAggregateFunctionInfo info(std::move(set));
	info.internal = true;
	catalog.CreateFunction(transaction, info);
}